

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable.hpp
# Opt level: O2

bool __thiscall
psst::meta::
or_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::is_empty>,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
::operator()(or_<afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::is_empty>,afsm::actions::detail::guard_check<afsm::inner_state_machine<vending::vending_def::on,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,vending::vending_def::on::maintenance,vending::events::end_maintenance,vending::vending_def::prices_correct>>
             *this,inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   *args,maintenance *args_1,end_maintenance *args_2)

{
  bool bVar1;
  
  bVar1 = vending::vending_def::is_empty((vending_def *)args->fsm_);
  if (bVar1) {
    return true;
  }
  bVar1 = vending::vending_def::prices_correct((vending_def *)args->fsm_);
  return bVar1;
}

Assistant:

bool
    operator()(Args&& ... args) const
    {
        return Predicate{}(::std::forward<Args>(args)...)
            || and_<Rest...>{}(::std::forward<Args>(args)...);
    }